

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O0

void gen_mtfsb0(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  byte bVar1;
  uint32_t uVar2;
  TCGv_i32 arg2;
  TCGv_i32 t0;
  uint8_t crb;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (((ctx->fpu_enabled ^ 0xffU) & 1) == 0) {
    uVar2 = crbD(ctx->opcode);
    bVar1 = 0x1f - (char)uVar2;
    gen_reset_fpstatus(tcg_ctx_00);
    if (bVar1 != 0x1e && bVar1 != 0x1d) {
      arg2 = tcg_const_i32_ppc64(tcg_ctx_00,(uint)bVar1);
      gen_helper_fpscr_clrbit(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2);
      tcg_temp_free_i32(tcg_ctx_00,arg2);
    }
    uVar2 = Rc(ctx->opcode);
    if (uVar2 != 0) {
      tcg_gen_extrl_i64_i32_ppc64(tcg_ctx_00,cpu_crf[1],cpu_fpscr);
      tcg_gen_shri_i32_ppc64(tcg_ctx_00,cpu_crf[1],cpu_crf[1],0x1c);
    }
  }
  else {
    gen_exception(ctx,7);
  }
  return;
}

Assistant:

static void gen_mtfsb0(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    uint8_t crb;

    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    crb = 31 - crbD(ctx->opcode);
    gen_reset_fpstatus(tcg_ctx);
    if (likely(crb != FPSCR_FEX && crb != FPSCR_VX)) {
        TCGv_i32 t0;
        t0 = tcg_const_i32(tcg_ctx, crb);
        gen_helper_fpscr_clrbit(tcg_ctx, tcg_ctx->cpu_env, t0);
        tcg_temp_free_i32(tcg_ctx, t0);
    }
    if (unlikely(Rc(ctx->opcode) != 0)) {
        tcg_gen_trunc_tl_i32(tcg_ctx, cpu_crf[1], cpu_fpscr);
        tcg_gen_shri_i32(tcg_ctx, cpu_crf[1], cpu_crf[1], FPSCR_OX);
    }
}